

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields.h
# Opt level: O0

void google::protobuf::internal::ReflectionVisit::
     VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::__0>
               (Message *message,anon_class_1_0_00000001 *func,FieldMask mask)

{
  uint uVar1;
  DoubleDynamicFieldInfo<google::protobuf::Message,_true> info;
  FloatDynamicFieldInfo<google::protobuf::Message,_true> info_00;
  Int64DynamicFieldInfo<google::protobuf::Message,_true> info_01;
  UInt64DynamicFieldInfo<google::protobuf::Message,_true> info_02;
  Int32DynamicFieldInfo<google::protobuf::Message,_true> info_03;
  Fixed64DynamicFieldInfo<google::protobuf::Message,_true> info_04;
  Fixed32DynamicFieldInfo<google::protobuf::Message,_true> info_05;
  BoolDynamicFieldInfo<google::protobuf::Message,_true> info_06;
  UInt32DynamicFieldInfo<google::protobuf::Message,_true> info_07;
  EnumDynamicFieldInfo<google::protobuf::Message,_true> info_08;
  SFixed32DynamicFieldInfo<google::protobuf::Message,_true> info_09;
  SFixed64DynamicFieldInfo<google::protobuf::Message,_true> info_10;
  SInt32DynamicFieldInfo<google::protobuf::Message,_true> info_11;
  SInt64DynamicFieldInfo<google::protobuf::Message,_true> info_12;
  MessageDynamicFieldInfo<google::protobuf::Message,_true> info_13;
  CordDynamicFieldInfo<google::protobuf::Message,_true> info_14;
  StringDynamicFieldInfo<google::protobuf::Message,_true> info_15;
  DoubleDynamicFieldInfo<google::protobuf::Message,_false> info_16;
  FloatDynamicFieldInfo<google::protobuf::Message,_false> info_17;
  Int64DynamicFieldInfo<google::protobuf::Message,_false> info_18;
  UInt64DynamicFieldInfo<google::protobuf::Message,_false> info_19;
  Int32DynamicFieldInfo<google::protobuf::Message,_false> info_20;
  Fixed64DynamicFieldInfo<google::protobuf::Message,_false> info_21;
  Fixed32DynamicFieldInfo<google::protobuf::Message,_false> info_22;
  BoolDynamicFieldInfo<google::protobuf::Message,_false> info_23;
  UInt32DynamicFieldInfo<google::protobuf::Message,_false> info_24;
  EnumDynamicFieldInfo<google::protobuf::Message,_false> info_25;
  SFixed32DynamicFieldInfo<google::protobuf::Message,_false> info_26;
  SFixed64DynamicFieldInfo<google::protobuf::Message,_false> info_27;
  SInt32DynamicFieldInfo<google::protobuf::Message,_false> info_28;
  SInt64DynamicFieldInfo<google::protobuf::Message,_false> info_29;
  MessageDynamicFieldInfo<google::protobuf::Message,_false> info_30;
  CordDynamicFieldInfo<google::protobuf::Message,_false> info_31;
  StringDynamicFieldInfo<google::protobuf::Message,_false> info_32;
  RepeatedDoubleDynamicFieldInfo<google::protobuf::Message> info_33;
  RepeatedFloatDynamicFieldInfo<google::protobuf::Message> info_34;
  RepeatedInt64DynamicFieldInfo<google::protobuf::Message> info_35;
  RepeatedUInt64DynamicFieldInfo<google::protobuf::Message> info_36;
  RepeatedInt32DynamicFieldInfo<google::protobuf::Message> info_37;
  RepeatedFixed64DynamicFieldInfo<google::protobuf::Message> info_38;
  RepeatedFixed32DynamicFieldInfo<google::protobuf::Message> info_39;
  RepeatedBoolDynamicFieldInfo<google::protobuf::Message> info_40;
  RepeatedUInt32DynamicFieldInfo<google::protobuf::Message> info_41;
  RepeatedEnumDynamicFieldInfo<google::protobuf::Message> info_42;
  RepeatedSFixed32DynamicFieldInfo<google::protobuf::Message> info_43;
  RepeatedSFixed64DynamicFieldInfo<google::protobuf::Message> info_44;
  RepeatedSInt32DynamicFieldInfo<google::protobuf::Message> info_45;
  RepeatedSInt64DynamicFieldInfo<google::protobuf::Message> info_46;
  RepeatedMessageDynamicFieldInfo<google::protobuf::Message> info_47;
  RepeatedGroupDynamicFieldInfo<google::protobuf::Message> info_48;
  RepeatedStringDynamicFieldInfo<google::protobuf::Message> info_49;
  MapDynamicFieldInfo<google::protobuf::Message> info_50;
  MapDynamicFieldInfo<google::protobuf::Message> info_51;
  FieldDescriptor *pFVar2;
  ReflectionSchema *pRVar3;
  FieldMask mask_00;
  __0 *p_Var4;
  anon_class_1_0_00000001 *paVar5;
  bool bVar6;
  CppType cpptype;
  int iVar7;
  Type TVar8;
  CppStringType CVar9;
  FieldOptions *this;
  LogMessage *pLVar10;
  FieldDescriptor *pFVar11;
  FieldDescriptor *pFVar12;
  uint *puVar13;
  char *pcVar14;
  ExtensionSet *pEVar15;
  int __c;
  bool local_ac9;
  uint32_t *local_928;
  DescriptorPool *pool;
  Descriptor *extendee;
  ExtensionSet *set;
  Message *local_8c8;
  FieldDescriptor *local_8c0;
  CordDynamicFieldInfo<google::protobuf::Message,_false> local_8b8;
  MessageDynamicFieldInfo<google::protobuf::Message,_false> local_8a0;
  SInt64DynamicFieldInfo<google::protobuf::Message,_false> local_888;
  SInt32DynamicFieldInfo<google::protobuf::Message,_false> local_870;
  SFixed64DynamicFieldInfo<google::protobuf::Message,_false> local_858;
  SFixed32DynamicFieldInfo<google::protobuf::Message,_false> local_840;
  EnumDynamicFieldInfo<google::protobuf::Message,_false> local_828;
  UInt32DynamicFieldInfo<google::protobuf::Message,_false> local_810;
  BoolDynamicFieldInfo<google::protobuf::Message,_false> local_7f8;
  Fixed32DynamicFieldInfo<google::protobuf::Message,_false> local_7e0;
  Fixed64DynamicFieldInfo<google::protobuf::Message,_false> local_7c8;
  Int32DynamicFieldInfo<google::protobuf::Message,_false> local_7b0;
  UInt64DynamicFieldInfo<google::protobuf::Message,_false> local_798;
  Int64DynamicFieldInfo<google::protobuf::Message,_false> local_780;
  FloatDynamicFieldInfo<google::protobuf::Message,_false> local_768;
  DoubleDynamicFieldInfo<google::protobuf::Message,_false> local_750;
  bool local_735;
  uint local_734;
  undefined1 auStack_730 [3];
  bool check_hasbits;
  uint32_t index;
  Message *local_728;
  FieldDescriptor *local_720;
  CordDynamicFieldInfo<google::protobuf::Message,_true> local_718;
  MessageDynamicFieldInfo<google::protobuf::Message,_true> local_700;
  SInt64DynamicFieldInfo<google::protobuf::Message,_true> local_6e8;
  SInt32DynamicFieldInfo<google::protobuf::Message,_true> local_6d0;
  SFixed64DynamicFieldInfo<google::protobuf::Message,_true> local_6b8;
  SFixed32DynamicFieldInfo<google::protobuf::Message,_true> local_6a0;
  EnumDynamicFieldInfo<google::protobuf::Message,_true> local_688;
  UInt32DynamicFieldInfo<google::protobuf::Message,_true> local_670;
  BoolDynamicFieldInfo<google::protobuf::Message,_true> local_658;
  Fixed32DynamicFieldInfo<google::protobuf::Message,_true> local_640;
  Fixed64DynamicFieldInfo<google::protobuf::Message,_true> local_628;
  Int32DynamicFieldInfo<google::protobuf::Message,_true> local_610;
  UInt64DynamicFieldInfo<google::protobuf::Message,_true> local_5f8;
  Int64DynamicFieldInfo<google::protobuf::Message,_true> local_5e0;
  FloatDynamicFieldInfo<google::protobuf::Message,_true> local_5c8;
  DoubleDynamicFieldInfo<google::protobuf::Message,_true> local_5b0;
  uint *local_598;
  uint32_t *oneof_case_array;
  OneofDescriptor *containing_oneof;
  Message *local_580;
  FieldDescriptor *local_578;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_570;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_568;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rep_16;
  Message *pMStack_558;
  FieldDescriptor *local_550;
  FieldDescriptor *pFStack_548;
  FieldDescriptor *local_540;
  MapFieldBase *pMStack_538;
  Descriptor *local_530;
  Descriptor *desc_1;
  MapFieldBase *map_1;
  Message *local_518;
  FieldDescriptor *local_510;
  RepeatedPtrField<google::protobuf::Message> *local_508;
  RepeatedPtrField<google::protobuf::Message> *local_500;
  RepeatedPtrField<google::protobuf::Message> *rep_15;
  Message *pMStack_4f0;
  FieldDescriptor *local_4e8;
  FieldDescriptor *pFStack_4e0;
  FieldDescriptor *local_4d8;
  MapFieldBase *pMStack_4d0;
  Descriptor *local_4c8;
  Descriptor *desc;
  MapFieldBase *map;
  Message *local_4b0;
  FieldDescriptor *local_4a8;
  RepeatedPtrField<google::protobuf::Message> *local_4a0;
  RepeatedPtrField<google::protobuf::Message> *local_498;
  RepeatedPtrField<google::protobuf::Message> *rep_14;
  Message *local_488;
  FieldDescriptor *local_480;
  RepeatedField<long> *local_478;
  RepeatedField<long> *local_470;
  RepeatedField<long> *rep_13;
  LogMessage local_460;
  Voidify local_449;
  RepeatedSInt32DynamicFieldInfo<google::protobuf::Message> local_448;
  RepeatedField<int> *local_428;
  RepeatedField<int> *rep_12;
  LogMessage local_418;
  Voidify local_401;
  RepeatedSFixed64DynamicFieldInfo<google::protobuf::Message> local_400;
  RepeatedField<long> *local_3e0;
  RepeatedField<long> *rep_11;
  LogMessage local_3d0;
  Voidify local_3b9;
  RepeatedSFixed32DynamicFieldInfo<google::protobuf::Message> local_3b8;
  RepeatedField<int> *local_398;
  RepeatedField<int> *rep_10;
  LogMessage local_388;
  Voidify local_371;
  RepeatedEnumDynamicFieldInfo<google::protobuf::Message> local_370;
  RepeatedField<int> *local_350;
  RepeatedField<int> *rep_9;
  LogMessage local_340;
  Voidify local_329;
  RepeatedUInt32DynamicFieldInfo<google::protobuf::Message> local_328;
  RepeatedField<unsigned_int> *local_308;
  RepeatedField<unsigned_int> *rep_8;
  LogMessage local_2f8;
  Voidify local_2e1;
  RepeatedBoolDynamicFieldInfo<google::protobuf::Message> local_2e0;
  RepeatedField<bool> *local_2c0;
  RepeatedField<bool> *rep_7;
  LogMessage local_2b0;
  Voidify local_299;
  RepeatedFixed32DynamicFieldInfo<google::protobuf::Message> local_298;
  RepeatedField<unsigned_int> *local_278;
  RepeatedField<unsigned_int> *rep_6;
  LogMessage local_268;
  Voidify local_251;
  RepeatedFixed64DynamicFieldInfo<google::protobuf::Message> local_250;
  RepeatedField<unsigned_long> *local_230;
  RepeatedField<unsigned_long> *rep_5;
  LogMessage local_220;
  Voidify local_209;
  RepeatedInt32DynamicFieldInfo<google::protobuf::Message> local_208;
  RepeatedField<int> *local_1e8;
  RepeatedField<int> *rep_4;
  LogMessage local_1d8;
  Voidify local_1c1;
  RepeatedUInt64DynamicFieldInfo<google::protobuf::Message> local_1c0;
  RepeatedField<unsigned_long> *local_1a0;
  RepeatedField<unsigned_long> *rep_3;
  LogMessage local_190;
  Voidify local_179;
  RepeatedInt64DynamicFieldInfo<google::protobuf::Message> local_178;
  RepeatedField<long> *local_158;
  RepeatedField<long> *rep_2;
  LogMessage local_148;
  Voidify local_131;
  RepeatedFloatDynamicFieldInfo<google::protobuf::Message> local_130;
  RepeatedField<float> *local_110;
  RepeatedField<float> *rep_1;
  LogMessage local_100;
  Voidify local_e9;
  RepeatedDoubleDynamicFieldInfo<google::protobuf::Message> local_e8;
  RepeatedField<double> *local_c8;
  RepeatedField<double> *rep;
  LogMessage local_b8;
  Voidify local_a2;
  byte local_a1;
  LogMessage local_a0;
  Voidify local_89;
  FieldDescriptor *local_88;
  FieldDescriptor *field;
  int i;
  int field_count;
  Descriptor *descriptor;
  uint32_t *has_bits_indices;
  uint32_t *has_bits;
  byte local_49;
  LogMessage local_48;
  Voidify local_31;
  ReflectionSchema *local_30;
  ReflectionSchema *schema;
  Reflection *reflection;
  anon_class_1_0_00000001 *paStack_18;
  FieldMask mask_local;
  anon_class_1_0_00000001 *func_local;
  Message *message_local;
  
  reflection._4_4_ = mask;
  paStack_18 = func;
  func_local = (anon_class_1_0_00000001 *)message;
  schema = (ReflectionSchema *)Message::GetReflection(message);
  local_30 = GetSchema((Reflection *)schema);
  bVar6 = ReflectionSchema::HasWeakFields(local_30);
  local_49 = 0;
  if (bVar6) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
               ,99,"!schema.HasWeakFields()");
    local_49 = 1;
    pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    pLVar10 = absl::lts_20250127::log_internal::LogMessage::operator<<
                        (pLVar10,(char (*) [30])"weak fields are not supported");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar10);
  }
  if ((local_49 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  bVar6 = ReflectionSchema::HasHasbits(local_30);
  if (bVar6) {
    local_928 = Reflection::GetHasBits((Reflection *)schema,(Message *)func_local);
  }
  else {
    local_928 = (uint32_t *)0x0;
  }
  has_bits_indices = local_928;
  descriptor = (Descriptor *)local_30->has_bit_indices_;
  _i = GetDescriptor((Reflection *)schema);
  field._4_4_ = Descriptor::field_count(_i);
  field._0_4_ = 0;
  do {
    if (field._4_4_ <= (int)field) {
      bVar6 = ReflectionSchema::HasExtensionSet(local_30);
      if (bVar6) {
        pEVar15 = ExtensionSet((Reflection *)schema,(Message *)func_local);
        internal::ExtensionSet::
        ForEach<google::protobuf::internal::ReflectionVisit::VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::__0>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::__0&&,google::protobuf::internal::FieldMask)::_lambda(int,auto:1&)_1_,google::protobuf::internal::ExtensionSet::Prefetch>
                  (pEVar15);
      }
      return;
    }
    local_88 = Descriptor::field(_i,(int)field);
    this = FieldDescriptor::options(local_88);
    bVar6 = FieldOptions::weak(this);
    local_a1 = 0;
    if (bVar6) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                 ,0x6e,"!field->options().weak()");
      local_a1 = 1;
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (pLVar10,(char (*) [30])"weak fields are not supported");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar10);
    }
    mask_00 = reflection._4_4_;
    if ((local_a1 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_a0);
    }
    cpptype = FieldDescriptor::cpp_type(local_88);
    bVar6 = ShouldVisit(mask_00,cpptype);
    if (bVar6) {
      bVar6 = FieldDescriptor::is_repeated(local_88);
      if (bVar6) {
        TVar8 = FieldDescriptor::type(local_88);
        switch(TVar8) {
        case TYPE_DOUBLE:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x7f,"!field->is_map()");
            rep._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_a2,pLVar10);
          }
          if ((rep._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_b8);
          }
          local_c8 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<double>>
                               ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<double>::size(local_c8);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedDoubleDynamicFieldInfo<google::protobuf::Message>::
            RepeatedDoubleDynamicFieldInfo
                      (&local_e8,(Reflection *)schema,(Message *)func_local,local_88,local_c8);
            info_33.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double>.
            message = local_e8.
                      super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double>.
                      message;
            info_33.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double>.
            reflection = local_e8.
                         super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double>
                         .reflection;
            info_33.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double>.
            field = local_e8.
                    super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double>.
                    field;
            info_33.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double>.
            const_repeated =
                 local_e8.
                 super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double>.
                 const_repeated;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_33);
          }
          break;
        case TYPE_FLOAT:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep_1._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_100,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x80,"!field->is_map()");
            rep_1._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_100);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_e9,pLVar10);
          }
          if ((rep_1._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_100);
          }
          local_110 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<float>>
                                ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<float>::size(local_110);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedFloatDynamicFieldInfo<google::protobuf::Message>::RepeatedFloatDynamicFieldInfo
                      (&local_130,(Reflection *)schema,(Message *)func_local,local_88,local_110);
            info_34.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float>.
            message = local_130.
                      super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float>.
                      message;
            info_34.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float>.
            reflection = local_130.
                         super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float>.
                         reflection;
            info_34.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float>.field
                 = local_130.
                   super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float>.field;
            info_34.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float>.
            const_repeated =
                 local_130.
                 super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float>.
                 const_repeated;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_34);
          }
          break;
        case TYPE_INT64:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep_2._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_148,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x81,"!field->is_map()");
            rep_2._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_148);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_131,pLVar10);
          }
          if ((rep_2._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_148);
          }
          local_158 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                                ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<long>::size(local_158);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedInt64DynamicFieldInfo<google::protobuf::Message>::RepeatedInt64DynamicFieldInfo
                      (&local_178,(Reflection *)schema,(Message *)func_local,local_88,local_158);
            info_35.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.
            message = local_178.
                      super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.
                      message;
            info_35.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.
            reflection = local_178.
                         super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.
                         reflection;
            info_35.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.field
                 = local_178.
                   super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.field;
            info_35.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.
            const_repeated =
                 local_178.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>
                 .const_repeated;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_35);
          }
          break;
        case TYPE_UINT64:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep_3._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_190,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x82,"!field->is_map()");
            rep_3._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_190);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_179,pLVar10);
          }
          if ((rep_3._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_190);
          }
          local_1a0 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                                ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<unsigned_long>::size(local_1a0);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedUInt64DynamicFieldInfo<google::protobuf::Message>::
            RepeatedUInt64DynamicFieldInfo
                      (&local_1c0,(Reflection *)schema,(Message *)func_local,local_88,local_1a0);
            info_36.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>.
            message = local_1c0.
                      super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>
                      .message;
            info_36.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>.
            reflection = local_1c0.
                         super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>
                         .reflection;
            info_36.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>.field
                 = local_1c0.
                   super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>
                   .field;
            info_36.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>.
            const_repeated =
                 local_1c0.
                 super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>.
                 const_repeated;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_36);
          }
          break;
        case TYPE_INT32:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep_4._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_1d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x83,"!field->is_map()");
            rep_4._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1d8);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_1c1,pLVar10);
          }
          if ((rep_4._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_1d8);
          }
          local_1e8 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                                ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<int>::size(local_1e8);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedInt32DynamicFieldInfo<google::protobuf::Message>::RepeatedInt32DynamicFieldInfo
                      (&local_208,(Reflection *)schema,(Message *)func_local,local_88,local_1e8);
            info_37.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.message
                 = local_208.
                   super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.message;
            info_37.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
            reflection = local_208.
                         super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
                         reflection;
            info_37.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.field =
                 local_208.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
                 field;
            info_37.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
            const_repeated =
                 local_208.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
                 const_repeated;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_37);
          }
          break;
        case TYPE_FIXED64:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep_5._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_220,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x84,"!field->is_map()");
            rep_5._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_220);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_209,pLVar10);
          }
          if ((rep_5._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_220);
          }
          local_230 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                                ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<unsigned_long>::size(local_230);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedFixed64DynamicFieldInfo<google::protobuf::Message>::
            RepeatedFixed64DynamicFieldInfo
                      (&local_250,(Reflection *)schema,(Message *)func_local,local_88,local_230);
            info_38.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>.
            message = local_250.
                      super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>
                      .message;
            info_38.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>.
            reflection = local_250.
                         super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>
                         .reflection;
            info_38.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>.field
                 = local_250.
                   super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>
                   .field;
            info_38.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>.
            const_repeated =
                 local_250.
                 super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>.
                 const_repeated;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_38);
          }
          break;
        case TYPE_FIXED32:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep_6._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_268,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x85,"!field->is_map()");
            rep_6._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_268);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_251,pLVar10);
          }
          if ((rep_6._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_268);
          }
          local_278 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                                ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<unsigned_int>::size(local_278);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedFixed32DynamicFieldInfo<google::protobuf::Message>::
            RepeatedFixed32DynamicFieldInfo
                      (&local_298,(Reflection *)schema,(Message *)func_local,local_88,local_278);
            info_39.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>.
            message = local_298.
                      super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>
                      .message;
            info_39.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>.
            reflection = local_298.
                         super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>
                         .reflection;
            info_39.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>.field
                 = local_298.
                   super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>
                   .field;
            info_39.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>.
            const_repeated =
                 local_298.
                 super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>.
                 const_repeated;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_39);
          }
          break;
        case TYPE_BOOL:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep_7._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x86,"!field->is_map()");
            rep_7._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2b0);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_299,pLVar10);
          }
          if ((rep_7._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_2b0);
          }
          local_2c0 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                                ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<bool>::size(local_2c0);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedBoolDynamicFieldInfo<google::protobuf::Message>::RepeatedBoolDynamicFieldInfo
                      (&local_2e0,(Reflection *)schema,(Message *)func_local,local_88,local_2c0);
            info_40.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool>.
            message = local_2e0.
                      super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool>.
                      message;
            info_40.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool>.
            reflection = local_2e0.
                         super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool>.
                         reflection;
            info_40.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool>.field
                 = local_2e0.
                   super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool>.field;
            info_40.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool>.
            const_repeated =
                 local_2e0.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool>
                 .const_repeated;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_40);
          }
          break;
        case TYPE_STRING:
        case TYPE_BYTES:
          CVar9 = FieldDescriptor::cpp_string_type(local_88);
          if (CVar9 - kView < 3) {
            local_568 = Reflection::
                        GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                                  ((Reflection *)schema,(Message *)func_local,local_88);
            iVar7 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::size(local_568);
            p_Var4 = (__0 *)paStack_18;
            if (iVar7 != 0) {
              RepeatedStringDynamicFieldInfo<google::protobuf::Message>::
              RepeatedStringDynamicFieldInfo
                        ((RepeatedStringDynamicFieldInfo<google::protobuf::Message> *)
                         &containing_oneof,(Reflection *)schema,(Message *)func_local,local_88,
                         local_568);
              info_49.
              super_RepeatedStringDynamicFieldInfoBase<google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super_RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .message = local_580;
              info_49.
              super_RepeatedStringDynamicFieldInfoBase<google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super_RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .reflection = (Reflection *)containing_oneof;
              info_49.
              super_RepeatedStringDynamicFieldInfoBase<google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super_RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field = local_578;
              info_49.
              super_RepeatedStringDynamicFieldInfoBase<google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super_RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .const_repeated = local_570;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_49);
            }
          }
          break;
        case TYPE_GROUP:
          bVar6 = FieldDescriptor::is_map(local_88);
          if (((bVar6 ^ 0xffU) & 1) == 0) {
            desc_1 = (Descriptor *)
                     Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                               ((Reflection *)schema,(Message *)func_local,local_88);
            iVar7 = MapFieldBase::size((MapFieldBase *)desc_1);
            if (iVar7 != 0) {
              local_530 = FieldDescriptor::message_type(local_88);
              paVar5 = func_local;
              p_Var4 = (__0 *)paStack_18;
              pRVar3 = schema;
              pFVar2 = local_88;
              pFVar11 = Descriptor::map_key(local_530);
              pFVar12 = Descriptor::map_value(local_530);
              MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
                        ((MapDynamicFieldInfo<google::protobuf::Message> *)&rep_16,
                         (Reflection *)pRVar3,(Message *)paVar5,pFVar2,pFVar11,pFVar12,
                         (MapFieldBase *)desc_1);
              info_51.message = pMStack_558;
              info_51.reflection = (Reflection *)rep_16;
              info_51.field = local_550;
              info_51.key = pFStack_548;
              info_51.value = local_540;
              info_51.const_map_field = pMStack_538;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_51);
            }
          }
          else {
            local_500 = Reflection::
                        GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                                  ((Reflection *)schema,(Message *)func_local,local_88);
            iVar7 = RepeatedPtrField<google::protobuf::Message>::size(local_500);
            p_Var4 = (__0 *)paStack_18;
            if (iVar7 != 0) {
              RepeatedGroupDynamicFieldInfo<google::protobuf::Message>::
              RepeatedGroupDynamicFieldInfo
                        ((RepeatedGroupDynamicFieldInfo<google::protobuf::Message> *)&map_1,
                         (Reflection *)schema,(Message *)func_local,local_88,local_500);
              info_48.
              super_RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
              .message = local_518;
              info_48.
              super_RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
              .reflection = (Reflection *)map_1;
              info_48.
              super_RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
              .field = local_510;
              info_48.
              super_RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
              .const_repeated = local_508;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_48);
            }
          }
          break;
        case TYPE_MESSAGE:
          bVar6 = FieldDescriptor::is_map(local_88);
          if (((bVar6 ^ 0xffU) & 1) == 0) {
            desc = (Descriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                             ((Reflection *)schema,(Message *)func_local,local_88);
            iVar7 = MapFieldBase::size((MapFieldBase *)desc);
            if (iVar7 != 0) {
              local_4c8 = FieldDescriptor::message_type(local_88);
              paVar5 = func_local;
              p_Var4 = (__0 *)paStack_18;
              pRVar3 = schema;
              pFVar2 = local_88;
              pFVar11 = Descriptor::map_key(local_4c8);
              pFVar12 = Descriptor::map_value(local_4c8);
              MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
                        ((MapDynamicFieldInfo<google::protobuf::Message> *)&rep_15,
                         (Reflection *)pRVar3,(Message *)paVar5,pFVar2,pFVar11,pFVar12,
                         (MapFieldBase *)desc);
              info_50.message = pMStack_4f0;
              info_50.reflection = (Reflection *)rep_15;
              info_50.field = local_4e8;
              info_50.key = pFStack_4e0;
              info_50.value = local_4d8;
              info_50.const_map_field = pMStack_4d0;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_50);
            }
          }
          else {
            local_498 = Reflection::
                        GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                                  ((Reflection *)schema,(Message *)func_local,local_88);
            iVar7 = RepeatedPtrField<google::protobuf::Message>::size(local_498);
            p_Var4 = (__0 *)paStack_18;
            if (iVar7 != 0) {
              RepeatedMessageDynamicFieldInfo<google::protobuf::Message>::
              RepeatedMessageDynamicFieldInfo
                        ((RepeatedMessageDynamicFieldInfo<google::protobuf::Message> *)&map,
                         (Reflection *)schema,(Message *)func_local,local_88,local_498);
              info_47.
              super_RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
              .message = local_4b0;
              info_47.
              super_RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
              .reflection = (Reflection *)map;
              info_47.
              super_RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
              .field = local_4a8;
              info_47.
              super_RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
              .const_repeated = local_4a0;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_47);
            }
          }
          break;
        case TYPE_UINT32:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep_8._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_2f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x87,"!field->is_map()");
            rep_8._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2f8);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_2e1,pLVar10);
          }
          if ((rep_8._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_2f8);
          }
          local_308 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                                ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<unsigned_int>::size(local_308);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedUInt32DynamicFieldInfo<google::protobuf::Message>::
            RepeatedUInt32DynamicFieldInfo
                      (&local_328,(Reflection *)schema,(Message *)func_local,local_88,local_308);
            info_41.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>.
            message = local_328.
                      super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>
                      .message;
            info_41.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>.
            reflection = local_328.
                         super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>
                         .reflection;
            info_41.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>.field
                 = local_328.
                   super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>
                   .field;
            info_41.
            super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>.
            const_repeated =
                 local_328.
                 super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>.
                 const_repeated;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_41);
          }
          break;
        case TYPE_ENUM:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep_9._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_340,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x88,"!field->is_map()");
            rep_9._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_340);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_329,pLVar10);
          }
          if ((rep_9._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_340);
          }
          local_350 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                                ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<int>::size(local_350);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedEnumDynamicFieldInfo<google::protobuf::Message>::RepeatedEnumDynamicFieldInfo
                      (&local_370,(Reflection *)schema,(Message *)func_local,local_88,local_350);
            info_42.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.message
                 = local_370.
                   super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.message;
            info_42.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
            reflection = local_370.
                         super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
                         reflection;
            info_42.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.field =
                 local_370.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
                 field;
            info_42.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
            const_repeated =
                 local_370.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
                 const_repeated;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_42);
          }
          break;
        case TYPE_SFIXED32:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep_10._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_388,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x89,"!field->is_map()");
            rep_10._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_388);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_371,pLVar10);
          }
          if ((rep_10._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_388);
          }
          local_398 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                                ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<int>::size(local_398);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedSFixed32DynamicFieldInfo<google::protobuf::Message>::
            RepeatedSFixed32DynamicFieldInfo
                      (&local_3b8,(Reflection *)schema,(Message *)func_local,local_88,local_398);
            info_43.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.message
                 = local_3b8.
                   super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.message;
            info_43.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
            reflection = local_3b8.
                         super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
                         reflection;
            info_43.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.field =
                 local_3b8.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
                 field;
            info_43.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
            const_repeated =
                 local_3b8.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
                 const_repeated;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_43);
          }
          break;
        case TYPE_SFIXED64:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep_11._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_3d0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x8a,"!field->is_map()");
            rep_11._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_3d0);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_3b9,pLVar10);
          }
          if ((rep_11._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_3d0);
          }
          local_3e0 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                                ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<long>::size(local_3e0);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedSFixed64DynamicFieldInfo<google::protobuf::Message>::
            RepeatedSFixed64DynamicFieldInfo
                      (&local_400,(Reflection *)schema,(Message *)func_local,local_88,local_3e0);
            info_44.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.
            message = local_400.
                      super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.
                      message;
            info_44.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.
            reflection = local_400.
                         super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.
                         reflection;
            info_44.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.field
                 = local_400.
                   super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.field;
            info_44.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.
            const_repeated =
                 local_400.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>
                 .const_repeated;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_44);
          }
          break;
        case TYPE_SINT32:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep_12._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_418,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x8b,"!field->is_map()");
            rep_12._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_418);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_401,pLVar10);
          }
          if ((rep_12._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_418);
          }
          local_428 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                                ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<int>::size(local_428);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedSInt32DynamicFieldInfo<google::protobuf::Message>::
            RepeatedSInt32DynamicFieldInfo
                      (&local_448,(Reflection *)schema,(Message *)func_local,local_88,local_428);
            info_45.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.message
                 = local_448.
                   super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.message;
            info_45.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
            reflection = local_448.
                         super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
                         reflection;
            info_45.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.field =
                 local_448.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
                 field;
            info_45.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
            const_repeated =
                 local_448.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>.
                 const_repeated;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_45);
          }
          break;
        case MAX_TYPE:
          bVar6 = FieldDescriptor::is_map(local_88);
          rep_13._7_1_ = 0;
          if (bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x8c,"!field->is_map()");
            rep_13._7_1_ = 1;
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_460);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_449,pLVar10);
          }
          if ((rep_13._7_1_ & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_460);
          }
          local_470 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                                ((Reflection *)schema,(Message *)func_local,local_88);
          iVar7 = RepeatedField<long>::size(local_470);
          p_Var4 = (__0 *)paStack_18;
          if (iVar7 != 0) {
            RepeatedSInt64DynamicFieldInfo<google::protobuf::Message>::
            RepeatedSInt64DynamicFieldInfo
                      ((RepeatedSInt64DynamicFieldInfo<google::protobuf::Message> *)&rep_14,
                       (Reflection *)schema,(Message *)func_local,local_88,local_470);
            info_46.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.
            message = local_488;
            info_46.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.
            reflection = (Reflection *)rep_14;
            info_46.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.field
                 = local_480;
            info_46.super_RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>.
            const_repeated = local_478;
            internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
            TestBody()::$_0::operator()(p_Var4,info_46);
          }
          break;
        default:
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                      ,0xbb);
        }
      }
      else {
        bVar6 = ReflectionSchema::InRealOneof(local_30,local_88);
        if (bVar6) {
          oneof_case_array = (uint32_t *)FieldDescriptor::containing_oneof(local_88);
          pcVar14 = (char *)(ulong)(uint)local_30->oneof_case_offset_;
          puVar13 = GetConstPointerAtOffset<unsigned_int>(func_local,local_30->oneof_case_offset_);
          local_598 = puVar13;
          pcVar14 = OneofDescriptor::index((OneofDescriptor *)oneof_case_array,pcVar14,__c);
          uVar1 = puVar13[(int)pcVar14];
          iVar7 = FieldDescriptor::number(local_88);
          if ((ulong)uVar1 == (long)iVar7) {
            TVar8 = FieldDescriptor::type(local_88);
            p_Var4 = (__0 *)paStack_18;
            switch(TVar8) {
            case TYPE_DOUBLE:
              DoubleDynamicFieldInfo<google::protobuf::Message,_true>::DoubleDynamicFieldInfo
                        (&local_5b0,(Reflection *)schema,(Message *)func_local,local_88);
              info.
              super_SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_true>
              .message = local_5b0.
                         super_SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_true>
                         .message;
              info.
              super_SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_true>
              .reflection = local_5b0.
                            super_SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_true>
                            .reflection;
              info.
              super_SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_true>
              .field = local_5b0.
                       super_SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_true>
                       .field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info);
              break;
            case TYPE_FLOAT:
              FloatDynamicFieldInfo<google::protobuf::Message,_true>::FloatDynamicFieldInfo
                        (&local_5c8,(Reflection *)schema,(Message *)func_local,local_88);
              info_00.
              super_SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_true>
              .message = local_5c8.
                         super_SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_true>
                         .message;
              info_00.
              super_SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_true>
              .reflection = local_5c8.
                            super_SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_true>
                            .reflection;
              info_00.
              super_SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_true>
              .field = local_5c8.
                       super_SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_true>
                       .field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_00);
              break;
            case TYPE_INT64:
              Int64DynamicFieldInfo<google::protobuf::Message,_true>::Int64DynamicFieldInfo
                        (&local_5e0,(Reflection *)schema,(Message *)func_local,local_88);
              info_01.
              super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
              .message = local_5e0.
                         super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
                         .message;
              info_01.
              super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
              .reflection = local_5e0.
                            super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
                            .reflection;
              info_01.
              super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
              .field = local_5e0.
                       super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
                       .field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_01);
              break;
            case TYPE_UINT64:
              UInt64DynamicFieldInfo<google::protobuf::Message,_true>::UInt64DynamicFieldInfo
                        (&local_5f8,(Reflection *)schema,(Message *)func_local,local_88);
              info_02.
              super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
              .message = local_5f8.
                         super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
                         .message;
              info_02.
              super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
              .reflection = local_5f8.
                            super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
                            .reflection;
              info_02.
              super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
              .field = local_5f8.
                       super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
                       .field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_02);
              break;
            case TYPE_INT32:
              Int32DynamicFieldInfo<google::protobuf::Message,_true>::Int32DynamicFieldInfo
                        (&local_610,(Reflection *)schema,(Message *)func_local,local_88);
              info_03.
              super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
              .message = local_610.
                         super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
                         .message;
              info_03.
              super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
              .reflection = local_610.
                            super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
                            .reflection;
              info_03.
              super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
              .field = local_610.
                       super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
                       .field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_03);
              break;
            case TYPE_FIXED64:
              Fixed64DynamicFieldInfo<google::protobuf::Message,_true>::Fixed64DynamicFieldInfo
                        (&local_628,(Reflection *)schema,(Message *)func_local,local_88);
              info_04.
              super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
              .message = local_628.
                         super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
                         .message;
              info_04.
              super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
              .reflection = local_628.
                            super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
                            .reflection;
              info_04.
              super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
              .field = local_628.
                       super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
                       .field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_04);
              break;
            case TYPE_FIXED32:
              Fixed32DynamicFieldInfo<google::protobuf::Message,_true>::Fixed32DynamicFieldInfo
                        (&local_640,(Reflection *)schema,(Message *)func_local,local_88);
              info_05.
              super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
              .message = local_640.
                         super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
                         .message;
              info_05.
              super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
              .reflection = local_640.
                            super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
                            .reflection;
              info_05.
              super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
              .field = local_640.
                       super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
                       .field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_05);
              break;
            case TYPE_BOOL:
              BoolDynamicFieldInfo<google::protobuf::Message,_true>::BoolDynamicFieldInfo
                        (&local_658,(Reflection *)schema,(Message *)func_local,local_88);
              info_06.
              super_SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_true>
              .message = local_658.
                         super_SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_true>
                         .message;
              info_06.
              super_SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_true>
              .reflection = local_658.
                            super_SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_true>
                            .reflection;
              info_06.
              super_SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_true>
              .field = local_658.
                       super_SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_true>
                       .field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_06);
              break;
            case TYPE_STRING:
            case TYPE_BYTES:
              CVar9 = FieldDescriptor::cpp_string_type(local_88);
              p_Var4 = (__0 *)paStack_18;
              if (CVar9 == kView) {
LAB_00c72739:
                StringDynamicFieldInfo<google::protobuf::Message,_true>::StringDynamicFieldInfo
                          ((StringDynamicFieldInfo<google::protobuf::Message,_true> *)auStack_730,
                           (Reflection *)schema,(Message *)func_local,local_88);
                info_15.message = local_728;
                info_15.reflection = _auStack_730;
                info_15.field = local_720;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_15);
              }
              else if (CVar9 == kCord) {
                CordDynamicFieldInfo<google::protobuf::Message,_true>::CordDynamicFieldInfo
                          (&local_718,(Reflection *)schema,(Message *)func_local,local_88);
                info_14.message = local_718.message;
                info_14.reflection = local_718.reflection;
                info_14.field = local_718.field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_14);
              }
              else if (CVar9 == kString) goto LAB_00c72739;
              break;
            case TYPE_GROUP:
            case TYPE_MESSAGE:
              MessageDynamicFieldInfo<google::protobuf::Message,_true>::MessageDynamicFieldInfo
                        (&local_700,(Reflection *)schema,(Message *)func_local,local_88);
              info_13.message = local_700.message;
              info_13.reflection = local_700.reflection;
              info_13.field = local_700.field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_13);
              break;
            case TYPE_UINT32:
              UInt32DynamicFieldInfo<google::protobuf::Message,_true>::UInt32DynamicFieldInfo
                        (&local_670,(Reflection *)schema,(Message *)func_local,local_88);
              info_07.
              super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
              .message = local_670.
                         super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
                         .message;
              info_07.
              super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
              .reflection = local_670.
                            super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
                            .reflection;
              info_07.
              super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
              .field = local_670.
                       super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
                       .field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_07);
              break;
            case TYPE_ENUM:
              EnumDynamicFieldInfo<google::protobuf::Message,_true>::EnumDynamicFieldInfo
                        (&local_688,(Reflection *)schema,(Message *)func_local,local_88);
              info_08.message = local_688.message;
              info_08.reflection = local_688.reflection;
              info_08.field = local_688.field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_08);
              break;
            case TYPE_SFIXED32:
              SFixed32DynamicFieldInfo<google::protobuf::Message,_true>::SFixed32DynamicFieldInfo
                        (&local_6a0,(Reflection *)schema,(Message *)func_local,local_88);
              info_09.
              super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
              .message = local_6a0.
                         super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
                         .message;
              info_09.
              super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
              .reflection = local_6a0.
                            super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
                            .reflection;
              info_09.
              super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
              .field = local_6a0.
                       super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
                       .field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_09);
              break;
            case TYPE_SFIXED64:
              SFixed64DynamicFieldInfo<google::protobuf::Message,_true>::SFixed64DynamicFieldInfo
                        (&local_6b8,(Reflection *)schema,(Message *)func_local,local_88);
              info_10.
              super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
              .message = local_6b8.
                         super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
                         .message;
              info_10.
              super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
              .reflection = local_6b8.
                            super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
                            .reflection;
              info_10.
              super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
              .field = local_6b8.
                       super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
                       .field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_10);
              break;
            case TYPE_SINT32:
              SInt32DynamicFieldInfo<google::protobuf::Message,_true>::SInt32DynamicFieldInfo
                        (&local_6d0,(Reflection *)schema,(Message *)func_local,local_88);
              info_11.
              super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
              .message = local_6d0.
                         super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
                         .message;
              info_11.
              super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
              .reflection = local_6d0.
                            super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
                            .reflection;
              info_11.
              super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
              .field = local_6d0.
                       super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
                       .field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_11);
              break;
            case MAX_TYPE:
              SInt64DynamicFieldInfo<google::protobuf::Message,_true>::SInt64DynamicFieldInfo
                        (&local_6e8,(Reflection *)schema,(Message *)func_local,local_88);
              info_12.
              super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
              .message = local_6e8.
                         super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
                         .message;
              info_12.
              super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
              .reflection = local_6e8.
                            super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
                            .reflection;
              info_12.
              super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
              .field = local_6e8.
                       super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
                       .field;
              internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
              TestBody()::$_0::operator()(p_Var4,info_12);
              break;
            default:
              Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                          ,0xf6);
            }
          }
        }
        else {
          local_734 = *(uint *)(&descriptor->super_SymbolBase + (long)(int)field * 4);
          local_ac9 = has_bits_indices != (uint32_t *)0x0 && local_734 != 0xffffffff;
          local_735 = local_ac9;
          if (has_bits_indices != (uint32_t *)0x0 && local_734 != 0xffffffff) {
            if ((has_bits_indices[local_734 >> 5] & 1 << ((byte)local_734 & 0x1f)) != 0) {
LAB_00c72835:
              TVar8 = FieldDescriptor::type(local_88);
              p_Var4 = (__0 *)paStack_18;
              switch(TVar8) {
              case TYPE_DOUBLE:
                DoubleDynamicFieldInfo<google::protobuf::Message,_false>::DoubleDynamicFieldInfo
                          (&local_750,(Reflection *)schema,(Message *)func_local,local_88);
                info_16.
                super_SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_false>
                .message = local_750.
                           super_SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_false>
                           .message;
                info_16.
                super_SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_false>
                .reflection = local_750.
                              super_SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_false>
                              .reflection;
                info_16.
                super_SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_false>
                .field = local_750.
                         super_SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_false>
                         .field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_16);
                break;
              case TYPE_FLOAT:
                FloatDynamicFieldInfo<google::protobuf::Message,_false>::FloatDynamicFieldInfo
                          (&local_768,(Reflection *)schema,(Message *)func_local,local_88);
                info_17.
                super_SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_false>
                .message = local_768.
                           super_SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_false>
                           .message;
                info_17.
                super_SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_false>
                .reflection = local_768.
                              super_SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_false>
                              .reflection;
                info_17.
                super_SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_false>
                .field = local_768.
                         super_SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_false>
                         .field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_17);
                break;
              case TYPE_INT64:
                Int64DynamicFieldInfo<google::protobuf::Message,_false>::Int64DynamicFieldInfo
                          (&local_780,(Reflection *)schema,(Message *)func_local,local_88);
                info_18.
                super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                .message = local_780.
                           super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                           .message;
                info_18.
                super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                .reflection = local_780.
                              super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                              .reflection;
                info_18.
                super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                .field = local_780.
                         super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                         .field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_18);
                break;
              case TYPE_UINT64:
                UInt64DynamicFieldInfo<google::protobuf::Message,_false>::UInt64DynamicFieldInfo
                          (&local_798,(Reflection *)schema,(Message *)func_local,local_88);
                info_19.
                super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
                .message = local_798.
                           super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
                           .message;
                info_19.
                super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
                .reflection = local_798.
                              super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
                              .reflection;
                info_19.
                super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
                .field = local_798.
                         super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
                         .field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_19);
                break;
              case TYPE_INT32:
                Int32DynamicFieldInfo<google::protobuf::Message,_false>::Int32DynamicFieldInfo
                          (&local_7b0,(Reflection *)schema,(Message *)func_local,local_88);
                info_20.
                super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                .message = local_7b0.
                           super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                           .message;
                info_20.
                super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                .reflection = local_7b0.
                              super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                              .reflection;
                info_20.
                super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                .field = local_7b0.
                         super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                         .field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_20);
                break;
              case TYPE_FIXED64:
                Fixed64DynamicFieldInfo<google::protobuf::Message,_false>::Fixed64DynamicFieldInfo
                          (&local_7c8,(Reflection *)schema,(Message *)func_local,local_88);
                info_21.
                super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
                .message = local_7c8.
                           super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
                           .message;
                info_21.
                super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
                .reflection = local_7c8.
                              super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
                              .reflection;
                info_21.
                super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
                .field = local_7c8.
                         super_SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
                         .field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_21);
                break;
              case TYPE_FIXED32:
                Fixed32DynamicFieldInfo<google::protobuf::Message,_false>::Fixed32DynamicFieldInfo
                          (&local_7e0,(Reflection *)schema,(Message *)func_local,local_88);
                info_22.
                super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
                .message = local_7e0.
                           super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
                           .message;
                info_22.
                super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
                .reflection = local_7e0.
                              super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
                              .reflection;
                info_22.
                super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
                .field = local_7e0.
                         super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
                         .field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_22);
                break;
              case TYPE_BOOL:
                BoolDynamicFieldInfo<google::protobuf::Message,_false>::BoolDynamicFieldInfo
                          (&local_7f8,(Reflection *)schema,(Message *)func_local,local_88);
                info_23.
                super_SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_false>
                .message = local_7f8.
                           super_SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_false>
                           .message;
                info_23.
                super_SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_false>
                .reflection = local_7f8.
                              super_SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_false>
                              .reflection;
                info_23.
                super_SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_false>
                .field = local_7f8.
                         super_SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_false>
                         .field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_23);
                break;
              case TYPE_STRING:
              case TYPE_BYTES:
                CVar9 = FieldDescriptor::cpp_string_type(local_88);
                p_Var4 = (__0 *)paStack_18;
                if (CVar9 == kView) {
LAB_00c72ddb:
                  StringDynamicFieldInfo<google::protobuf::Message,_false>::StringDynamicFieldInfo
                            ((StringDynamicFieldInfo<google::protobuf::Message,_false> *)&set,
                             (Reflection *)schema,(Message *)func_local,local_88);
                  info_32.message = local_8c8;
                  info_32.reflection = (Reflection *)set;
                  info_32.field = local_8c0;
                  internal::(anonymous_namespace)::
                  VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::$_0::operator()
                            (p_Var4,info_32);
                }
                else if (CVar9 == kCord) {
                  CordDynamicFieldInfo<google::protobuf::Message,_false>::CordDynamicFieldInfo
                            (&local_8b8,(Reflection *)schema,(Message *)func_local,local_88);
                  info_31.message = local_8b8.message;
                  info_31.reflection = local_8b8.reflection;
                  info_31.field = local_8b8.field;
                  internal::(anonymous_namespace)::
                  VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::$_0::operator()
                            (p_Var4,info_31);
                }
                else if (CVar9 == kString) goto LAB_00c72ddb;
                break;
              case TYPE_GROUP:
              case TYPE_MESSAGE:
                MessageDynamicFieldInfo<google::protobuf::Message,_false>::MessageDynamicFieldInfo
                          (&local_8a0,(Reflection *)schema,(Message *)func_local,local_88);
                info_30.message = local_8a0.message;
                info_30.reflection = local_8a0.reflection;
                info_30.field = local_8a0.field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_30);
                break;
              case TYPE_UINT32:
                UInt32DynamicFieldInfo<google::protobuf::Message,_false>::UInt32DynamicFieldInfo
                          (&local_810,(Reflection *)schema,(Message *)func_local,local_88);
                info_24.
                super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
                .message = local_810.
                           super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
                           .message;
                info_24.
                super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
                .reflection = local_810.
                              super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
                              .reflection;
                info_24.
                super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
                .field = local_810.
                         super_SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
                         .field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_24);
                break;
              case TYPE_ENUM:
                EnumDynamicFieldInfo<google::protobuf::Message,_false>::EnumDynamicFieldInfo
                          (&local_828,(Reflection *)schema,(Message *)func_local,local_88);
                info_25.message = local_828.message;
                info_25.reflection = local_828.reflection;
                info_25.field = local_828.field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_25);
                break;
              case TYPE_SFIXED32:
                SFixed32DynamicFieldInfo<google::protobuf::Message,_false>::SFixed32DynamicFieldInfo
                          (&local_840,(Reflection *)schema,(Message *)func_local,local_88);
                info_26.
                super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                .message = local_840.
                           super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                           .message;
                info_26.
                super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                .reflection = local_840.
                              super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                              .reflection;
                info_26.
                super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                .field = local_840.
                         super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                         .field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_26);
                break;
              case TYPE_SFIXED64:
                SFixed64DynamicFieldInfo<google::protobuf::Message,_false>::SFixed64DynamicFieldInfo
                          (&local_858,(Reflection *)schema,(Message *)func_local,local_88);
                info_27.
                super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                .message = local_858.
                           super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                           .message;
                info_27.
                super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                .reflection = local_858.
                              super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                              .reflection;
                info_27.
                super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                .field = local_858.
                         super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                         .field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_27);
                break;
              case TYPE_SINT32:
                SInt32DynamicFieldInfo<google::protobuf::Message,_false>::SInt32DynamicFieldInfo
                          (&local_870,(Reflection *)schema,(Message *)func_local,local_88);
                info_28.
                super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                .message = local_870.
                           super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                           .message;
                info_28.
                super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                .reflection = local_870.
                              super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                              .reflection;
                info_28.
                super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                .field = local_870.
                         super_SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                         .field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_28);
                break;
              case MAX_TYPE:
                SInt64DynamicFieldInfo<google::protobuf::Message,_false>::SInt64DynamicFieldInfo
                          (&local_888,(Reflection *)schema,(Message *)func_local,local_88);
                info_29.
                super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                .message = local_888.
                           super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                           .message;
                info_29.
                super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                .reflection = local_888.
                              super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                              .reflection;
                info_29.
                super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                .field = local_888.
                         super_SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                         .field;
                internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test
                ::TestBody()::$_0::operator()(p_Var4,info_29);
                break;
              default:
                Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                            ,0x12d);
              }
            }
          }
          else {
            bVar6 = Reflection::HasFieldSingular
                              ((Reflection *)schema,(Message *)func_local,local_88);
            if (bVar6) goto LAB_00c72835;
          }
        }
      }
    }
    field._0_4_ = (int)field + 1;
  } while( true );
}

Assistant:

void ReflectionVisit::VisitFields(MessageT& message, CallbackFn&& func,
                                  FieldMask mask) {
  const Reflection* reflection = message.GetReflection();
  const auto& schema = GetSchema(reflection);

  ABSL_CHECK(!schema.HasWeakFields()) << "weak fields are not supported";

  // See Reflection::ListFields for the optimization.
  const uint32_t* const has_bits =
      schema.HasHasbits() ? reflection->GetHasBits(message) : nullptr;
  const uint32_t* const has_bits_indices = schema.has_bit_indices_;
  const Descriptor* descriptor = GetDescriptor(reflection);
  const int field_count = descriptor->field_count();

  for (int i = 0; i < field_count; i++) {
    const FieldDescriptor* field = descriptor->field(i);
    ABSL_DCHECK(!field->options().weak()) << "weak fields are not supported";

    if (!ShouldVisit(mask, field->cpp_type())) continue;

    if (field->is_repeated()) {
      switch (field->type()) {
#define PROTOBUF_HANDLE_REPEATED_CASE(TYPE, CPPTYPE, NAME)                  \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    ABSL_DCHECK(!field->is_map());                                          \
    const auto& rep =                                                       \
        reflection->GetRawNonOneof<RepeatedField<CPPTYPE>>(message, field); \
    if (rep.size() == 0) continue;                                          \
    func(internal::Repeated##NAME##DynamicFieldInfo<MessageT>{              \
        reflection, message, field, rep});                                  \
    break;                                                                  \
  }

        PROTOBUF_HANDLE_REPEATED_CASE(DOUBLE, double, Double);
        PROTOBUF_HANDLE_REPEATED_CASE(FLOAT, float, Float);
        PROTOBUF_HANDLE_REPEATED_CASE(INT64, int64_t, Int64);
        PROTOBUF_HANDLE_REPEATED_CASE(UINT64, uint64_t, UInt64);
        PROTOBUF_HANDLE_REPEATED_CASE(INT32, int32_t, Int32);
        PROTOBUF_HANDLE_REPEATED_CASE(FIXED64, uint64_t, Fixed64);
        PROTOBUF_HANDLE_REPEATED_CASE(FIXED32, uint32_t, Fixed32);
        PROTOBUF_HANDLE_REPEATED_CASE(BOOL, bool, Bool);
        PROTOBUF_HANDLE_REPEATED_CASE(UINT32, uint32_t, UInt32);
        PROTOBUF_HANDLE_REPEATED_CASE(ENUM, int, Enum);
        PROTOBUF_HANDLE_REPEATED_CASE(SFIXED32, int32_t, SFixed32);
        PROTOBUF_HANDLE_REPEATED_CASE(SFIXED64, int64_t, SFixed64);
        PROTOBUF_HANDLE_REPEATED_CASE(SINT32, int32_t, SInt32);
        PROTOBUF_HANDLE_REPEATED_CASE(SINT64, int64_t, SInt64);

#define PROTOBUF_HANDLE_REPEATED_PTR_CASE(TYPE, CPPTYPE, NAME)                 \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    if (ABSL_PREDICT_TRUE(!field->is_map())) {                                 \
      /* Handle repeated fields. */                                            \
      const auto& rep = reflection->GetRawNonOneof<RepeatedPtrField<CPPTYPE>>( \
          message, field);                                                     \
      if (rep.size() == 0) continue;                                           \
      func(internal::Repeated##NAME##DynamicFieldInfo<MessageT>{               \
          reflection, message, field, rep});                                   \
    } else {                                                                   \
      /* Handle map fields. */                                                 \
      const auto& map =                                                        \
          reflection->GetRawNonOneof<MapFieldBase>(message, field);            \
      if (map.size() == 0) continue; /* NOLINT */                              \
      const Descriptor* desc = field->message_type();                          \
      func(internal::MapDynamicFieldInfo<MessageT>{reflection, message, field, \
                                                   desc->map_key(),            \
                                                   desc->map_value(), map});   \
    }                                                                          \
    break;                                                                     \
  }

        PROTOBUF_HANDLE_REPEATED_PTR_CASE(MESSAGE, Message, Message);
        PROTOBUF_HANDLE_REPEATED_PTR_CASE(GROUP, Message, Group);

        case FieldDescriptor::TYPE_BYTES:
        case FieldDescriptor::TYPE_STRING:
#define PROTOBUF_IMPL_STRING_CASE(CPPTYPE, NAME)                               \
  {                                                                            \
    const auto& rep =                                                          \
        reflection->GetRawNonOneof<RepeatedPtrField<CPPTYPE>>(message, field); \
    if (rep.size() == 0) continue;                                             \
    func(internal::Repeated##NAME##DynamicFieldInfo<MessageT>{                 \
        reflection, message, field, rep});                                     \
  }

          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              PROTOBUF_IMPL_STRING_CASE(std::string, String);
              break;
          }
          break;
        default:
          internal::Unreachable();
          break;
      }